

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall
opts::OptionContainer<bool>::OptionContainer
          (OptionContainer<bool> *this,char s_,string *l_,bool *var_,string *help_)

{
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  string *in_R8;
  string local_c8 [24];
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff8f;
  BasicOption *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  undefined8 local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_48,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::string(local_c8,local_28);
  BasicOption::BasicOption
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_48);
  *in_RDI = &PTR__OptionContainer_001ec9a0;
  in_RDI[0x12] = local_20;
  *(undefined1 *)in_RDI[0x12] = 0;
  return;
}

Assistant:

OptionContainer(char               s_,
                                    const std::string& l_,
                                    bool&              var_,
                                    const std::string& help_):
                        BasicOption(s_, l_, "", "", help_),
                        var(&var_)                          { *var = false; }